

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_or.h
# Opt level: O1

void __thiscall
mp::
OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxNeg(OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict14 *disj,int param_2)

{
  type tVar1;
  type *ptVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  type *ptVar3;
  NodeRange nr;
  LinTerms local_148;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_d0;
  
  ptVar3 = (type *)(disj->
                   super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                   ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  ptVar2 = (type *)(disj->
                   super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                   ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (ptVar3 != ptVar2) {
    tVar1 = (type)(disj->super_FunctionalConstraint).result_var_;
    do {
      local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
           tVar1;
      local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
           *ptVar3;
      this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *)(this->
                   super_BasicFuncConstrCvt<mp::OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   ).
                   super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   .mdl_cvt_;
      local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 m_storage;
      local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data
      [0] = (type)0x3ff0000000000000;
      local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data
      [1] = (type)&DAT_bff0000000000000;
      local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 2;
      local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)&local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
      local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 2;
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (&local_d0,&local_148,(AlgConRhs<_1>)0x0,true);
      nr = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           ::
           AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                     ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                       *)this_00,&local_d0);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink(this_00,nr);
      if (6 < local_d0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_d0.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_d0.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_d0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_d0.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_d0.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_d0.super_BasicConstraint.name_.field_2) {
        operator_delete(local_d0.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_d0.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_148.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_148.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      ptVar3 = ptVar3 + 1;
    } while (ptVar3 != ptVar2);
  }
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& disj, int ) {
    std::array<double, 2> coefs{1.0, -1.0};
    std::array<int, 2> vars{-1, disj.GetResultVar()};
    for (auto arg: disj.GetArguments()) {        // res >= arg[i] in CTX-
      vars[0] = arg;
      GetMC().AddConstraint(
                     LinConLE({coefs, vars}, {0.0} ));
    }
  }